

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

int moveto_snode_alldesc
              (lyxp_set *set,lys_node *cur_node,char *qname,uint16_t qname_len,int options)

{
  LYS_NODE LVar1;
  int iVar2;
  char *pcVar3;
  ly_ctx *plVar4;
  LY_ERR *pLVar5;
  lys_module *plVar6;
  lyxp_node_type local_74;
  ly_ctx *plStack_70;
  lyxp_node_type root_type;
  ly_ctx *ctx;
  lys_module *moveto_mod;
  lys_node *start;
  lys_node *elem;
  lys_node *next;
  int idx;
  int match;
  int all;
  int pref_len;
  int orig_used;
  int i;
  int options_local;
  uint16_t qname_len_local;
  char *qname_local;
  lys_node *cur_node_local;
  lyxp_set *set_local;
  
  idx = 0;
  if ((set == (lyxp_set *)0x0) || (set->type == LYXP_SET_EMPTY)) {
    set_local._4_4_ = 0;
  }
  else {
    orig_used = options;
    i._2_2_ = qname_len;
    _options_local = qname;
    qname_local = (char *)cur_node;
    cur_node_local = (lys_node *)set;
    if (set->type == LYXP_SET_SNODE_SET) {
      plStack_70 = cur_node->module->ctx;
      moveto_snode_get_root(cur_node,options,&local_74);
      next._0_4_ = moveto_snode((lyxp_set *)cur_node_local,(lys_node *)qname_local,_options_local,
                                i._2_2_,orig_used);
      set_local._4_4_ = (int)next;
      if ((int)next == 0) {
        pcVar3 = strnchr(_options_local,0x3a,(uint)i._2_2_);
        if (pcVar3 == (char *)0x0) {
          ctx = (ly_ctx *)0x0;
        }
        else {
          pcVar3 = strnchr(_options_local,0x3a,(uint)i._2_2_);
          match = (int)pcVar3 - (int)_options_local;
          ctx = (ly_ctx *)
                moveto_resolve_model
                          (_options_local,(uint16_t)match,plStack_70,(lys_node *)qname_local,1);
          if (ctx == (ly_ctx *)0x0) {
            ly_vlog(LYE_XPATH_INMOD,LY_VLOG_NONE,(void *)0x0,(ulong)(uint)match,_options_local);
            return -1;
          }
          _options_local = _options_local + (match + 1);
          i._2_2_ = i._2_2_ - ((short)match + 1);
        }
        if ((i._2_2_ == 1) && (*_options_local == '*')) {
          idx = 1;
        }
        all = *(int *)&cur_node_local->ext;
        for (pref_len = 0; pref_len < all; pref_len = pref_len + 1) {
          if (*(int *)(cur_node_local->ref + (long)pref_len * 0x10 + 0xc) == 1) {
            moveto_mod = *(lys_module **)(cur_node_local->ref + (long)pref_len * 0x10);
            elem = (lys_node *)moveto_mod;
            while (elem != (lys_node *)0x0) {
              start = elem;
              if ((local_74 == LYXP_NODE_ROOT_CONFIG) && ((elem->flags & 2) != 0))
              goto LAB_001a2242;
              LVar1 = elem->nodetype;
              if ((LVar1 == LYS_CHOICE) || (LVar1 == LYS_CASE)) {
LAB_001a2214:
                elem = start->child;
                if ((start->nodetype & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) != LYS_UNKNOWN) {
                  elem = (lys_node *)0x0;
                }
                if (elem == (lys_node *)0x0) goto LAB_001a2242;
              }
              else {
                if (LVar1 == LYS_INPUT) {
                  if ((orig_used & 0x20U) != 0) goto LAB_001a2242;
                  goto LAB_001a2214;
                }
                if (LVar1 == LYS_OUTPUT) {
                  if ((orig_used & 0x20U) != 0) goto LAB_001a2214;
                }
                else if (LVar1 != LYS_GROUPING) {
                  if (LVar1 != LYS_USES) {
                    next._4_4_ = 1;
                    if ((ctx != (ly_ctx *)0x0) &&
                       (plVar4 = (ly_ctx *)lys_node_module(elem), plVar4 != ctx)) {
                      next._4_4_ = 0;
                    }
                    if ((idx == 0) &&
                       ((iVar2 = strncmp(start->name,_options_local,(ulong)i._2_2_), iVar2 != 0 ||
                        (start->name[i._2_2_] != '\0')))) {
                      next._4_4_ = 0;
                    }
                    if ((next._4_4_ == 0) || ((lys_module *)start == moveto_mod)) {
                      if ((next._4_4_ == 0) && ((lys_module *)start == moveto_mod)) {
                        pLVar5 = ly_errno_location();
                        *pLVar5 = LY_EINT;
                        ly_log(LY_LLERR,"Internal error (%s:%d).",
                               "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/xpath.c"
                               ,0x12eb);
                      }
                    }
                    else {
                      next._0_4_ = set_snode_dup_node_check
                                             ((lyxp_set *)cur_node_local,start,LYXP_NODE_ELEM,
                                              pref_len);
                      if ((int)next < 0) {
                        set_snode_insert_node((lyxp_set *)cur_node_local,start,LYXP_NODE_ELEM);
                      }
                      else {
                        pcVar3 = cur_node_local->ref + (long)(int)next * 0x10 + 0xc;
                        pcVar3[0] = '\x01';
                        pcVar3[1] = '\0';
                        pcVar3[2] = '\0';
                        pcVar3[3] = '\0';
                        if (pref_len < (int)next) goto LAB_001a2242;
                      }
                    }
                  }
                  goto LAB_001a2214;
                }
LAB_001a2242:
                if ((lys_module *)start == moveto_mod) break;
                elem = start->next;
              }
              while ((elem == (lys_node *)0x0 &&
                     (plVar6 = (lys_module *)lys_parent(start), plVar6 != moveto_mod))) {
                start = lys_parent(start);
                elem = start->next;
              }
            }
          }
        }
        set_local._4_4_ = 0;
      }
    }
    else {
      pcVar3 = print_set_type(set);
      ly_vlog(LYE_XPATH_INOP_1,LY_VLOG_NONE,(void *)0x0,"path operator",pcVar3);
      set_local._4_4_ = -1;
    }
  }
  return set_local._4_4_;
}

Assistant:

static int
moveto_snode_alldesc(struct lyxp_set *set, struct lys_node *cur_node, const char *qname, uint16_t qname_len,
                     int options)
{
    int i, orig_used, pref_len, all = 0, match, idx;
    struct lys_node *next, *elem, *start;
    struct lys_module *moveto_mod;
    struct ly_ctx *ctx;
    enum lyxp_node_type root_type;

    if (!set || (set->type == LYXP_SET_EMPTY)) {
        return EXIT_SUCCESS;
    }

    if (set->type != LYXP_SET_SNODE_SET) {
        LOGVAL(LYE_XPATH_INOP_1, LY_VLOG_NONE, NULL, "path operator", print_set_type(set));
        return -1;
    }

    ctx = cur_node->module->ctx;
    moveto_snode_get_root(cur_node, options, &root_type);

    /* add all matching direct descendant nodes */
    idx = moveto_snode(set, cur_node, qname, qname_len, options);
    if (idx) {
        return idx;
    }

    /* prefix */
    if (strnchr(qname, ':', qname_len)) {
        pref_len = strnchr(qname, ':', qname_len) - qname;
        moveto_mod = moveto_resolve_model(qname, pref_len, ctx, cur_node, 1);
        if (!moveto_mod) {
            LOGVAL(LYE_XPATH_INMOD, LY_VLOG_NONE, NULL, pref_len, qname);
            return -1;
        }
        qname += pref_len + 1;
        qname_len -= pref_len + 1;
    } else {
        moveto_mod = NULL;
    }

    if ((qname_len == 1) && (qname[0] == '*')) {
        all = 1;
    }

    orig_used = set->used;
    for (i = 0; i < orig_used; ++i) {
        if (set->val.snodes[i].in_ctx != 1) {
            continue;
        }

        /* TREE DFS */
        start = set->val.snodes[i].snode;
        for (elem = next = start; elem; elem = next) {

            /* context/nodetype check */
            if ((root_type == LYXP_NODE_ROOT_CONFIG) && (elem->flags & LYS_CONFIG_R)) {
                /* valid node, but it is hidden in this context */
                goto skip_children;
            }
            switch (elem->nodetype) {
            case LYS_USES:
            case LYS_CHOICE:
            case LYS_CASE:
                /* schema-only nodes */
                goto next_iter;
            case LYS_INPUT:
                if (options & LYXP_SNODE_OUTPUT) {
                    goto skip_children;
                }
                goto next_iter;
            case LYS_OUTPUT:
                if (!(options & LYXP_SNODE_OUTPUT)) {
                    goto skip_children;
                }
                goto next_iter;
            case LYS_GROUPING:
                goto skip_children;
            default:
                break;
            }

            match = 1;

            /* module check */
            if (moveto_mod && (lys_node_module(elem) != moveto_mod)) {
                match = 0;
            }

            /* name check */
            if (!all && (strncmp(elem->name, qname, qname_len) || elem->name[qname_len])) {
                match = 0;
            }

            if (match && (elem != start)) {
                if ((idx = set_snode_dup_node_check(set, elem, LYXP_NODE_ELEM, i)) > -1) {
                    set->val.snodes[idx].in_ctx = 1;
                    if (idx > i) {
                        /* we will process it later in the set */
                        goto skip_children;
                    }
                } else {
                    set_snode_insert_node(set, elem, LYXP_NODE_ELEM);
                }
            } else if (!match && (elem == start)) {
                /* start node must match! */
                LOGINT;
            }

next_iter:
            /* TREE DFS NEXT ELEM */
            /* select element for the next run - children first */
            next = elem->child;
            if (elem->nodetype & (LYS_LEAF | LYS_LEAFLIST | LYS_ANYDATA)) {
                next = NULL;
            }
            if (!next) {
skip_children:
                /* no children, so try siblings, but only if it's not the start,
                 * that is considered to be the root and it's siblings are not traversed */
                if (elem != start) {
                    next = elem->next;
                } else {
                    break;
                }
            }
            while (!next) {
                /* no siblings, go back through the parents */
                if (lys_parent(elem) == start) {
                    /* we are done, no next element to process */
                    break;
                }
                /* parent is already processed, go to its sibling */
                elem = lys_parent(elem);
                next = elem->next;
            }
        }
    }

    return EXIT_SUCCESS;
}